

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromMemory::load(Mat *__return_storage_ptr__,ModelBinFromMemory *this,int w,int type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  uchar *puVar6;
  uchar *puVar7;
  void *pvVar8;
  uchar **ppuVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  ppuVar9 = this->mem;
  pbVar5 = *ppuVar9;
  if (pbVar5 != (byte *)0x0) {
    if (type == 1) {
      __return_storage_ptr__->data = pbVar5;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->packing = 1;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)w;
      *ppuVar9 = pbVar5 + (long)w * 4;
      return __return_storage_ptr__;
    }
    if (type != 0) {
      fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)(uint)type);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      goto LAB_0011b1b8;
    }
    bVar1 = *pbVar5;
    bVar2 = pbVar5[1];
    bVar3 = pbVar5[2];
    bVar4 = pbVar5[3];
    *ppuVar9 = pbVar5 + 4;
    uVar12 = (uint)bVar2 << 8 | (uint)bVar3 << 0x10 | (uint)bVar4 << 0x18 | (uint)bVar1;
    if (uVar12 != 0x2c056) {
      if (uVar12 == 0xd4b38) {
        ppuVar9 = this->mem;
        __return_storage_ptr__->data = *ppuVar9;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->elemsize = 1;
        __return_storage_ptr__->packing = 1;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 1;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = 1;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = (long)w;
        uVar11 = (long)w + 3U & 0xfffffffffffffffc;
        goto LAB_0011b204;
      }
      if (uVar12 == 0x1306b47) {
        Mat::from_float16(__return_storage_ptr__,(unsigned_short *)*this->mem,w);
        *this->mem = *this->mem + ((long)w * 2 + 3U & 0xfffffffffffffffc);
        return __return_storage_ptr__;
      }
      if ((uint)bVar2 + (uint)bVar1 + (uint)bVar3 != 0 || bVar4 != 0) {
        puVar6 = *this->mem;
        *this->mem = puVar6 + 0x400;
        puVar7 = *this->mem;
        *this->mem = puVar7 + ((long)w + 3U & 0xfffffffffffffffc);
        Mat::Mat(__return_storage_ptr__,w,4,(Allocator *)0x0);
        pvVar8 = __return_storage_ptr__->data;
        if (pvVar8 == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        uVar10 = 0;
        uVar11 = (ulong)(uint)w;
        if (w < 1) {
          uVar11 = uVar10;
        }
        for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined4 *)((long)pvVar8 + uVar10 * 4) =
               *(undefined4 *)(puVar6 + (ulong)puVar7[uVar10] * 4);
        }
        return __return_storage_ptr__;
      }
      if (bVar1 != 0) goto LAB_0011b1ae;
    }
    ppuVar9 = this->mem;
    __return_storage_ptr__->data = *ppuVar9;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->elemsize = 4;
    __return_storage_ptr__->packing = 1;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 1;
    __return_storage_ptr__->w = w;
    __return_storage_ptr__->h = 1;
    __return_storage_ptr__->c = 1;
    __return_storage_ptr__->cstep = (long)w;
    uVar11 = (long)w << 2;
LAB_0011b204:
    *ppuVar9 = *ppuVar9 + uVar11;
    return __return_storage_ptr__;
  }
LAB_0011b1ae:
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
LAB_0011b1b8:
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMemory::load(int w, int type) const
{
    if (!mem)
        return Mat();

    if (type == 0)
    {
        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        memcpy(&flag_struct, mem, sizeof(flag_struct));
        mem += sizeof(flag_struct);

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            Mat m = Mat::from_float16((unsigned short*)mem, w);
            mem += alignSize(w * sizeof(unsigned short), 4);
            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            Mat m = Mat(w, (signed char*)mem, 1u);
            mem += alignSize(w, 4);
            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // raw data with extra scaling
            Mat m = Mat(w, (float*)mem);
            mem += w * sizeof(float);
            return m;
        }

        if (flag != 0)
        {
            // quantized data
            const float* quantization_value = (const float*)mem;
            mem += 256 * sizeof(float);

            const unsigned char* index_array = (const unsigned char*)mem;
            mem += alignSize(w * sizeof(unsigned char), 4);

            Mat m(w);
            if (m.empty())
                return m;

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }

            return m;
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            Mat m = Mat(w, (float*)mem);
            mem += w * sizeof(float);
            return m;
        }
    }
    else if (type == 1)
    {
        // raw data
        Mat m = Mat(w, (float*)mem);
        mem += w * sizeof(float);
        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}